

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::gatherArray2DOffsetsCompare
          (tcu *this,ConstPixelBufferAccess *src,Sampler *sampler,float ref,float s,float t,
          int depth,IVec2 (*offsets) [4])

{
  CompareMode CVar1;
  TextureChannelClass TVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  Vec4 VVar8;
  Vec4 gathered;
  tcu local_40 [16];
  
  TVar2 = getTextureChannelClass((src->m_format).type);
  lVar3 = 0;
  fetchGatherArray2DOffsets(local_40,src,sampler,s,t,depth,0,offsets);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  CVar1 = sampler->compare;
  fVar4 = 1.0;
  if (ref <= 1.0) {
    fVar4 = ref;
  }
  do {
    fVar7 = *(float *)(local_40 + lVar3 * 4);
    fVar5 = ref;
    if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar5 = 1.0;
      if (fVar7 <= 1.0) {
        fVar5 = fVar7;
      }
      fVar7 = (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar5);
      fVar5 = (float)(~-(uint)(ref < 0.0) & (uint)fVar4);
    }
    uVar6 = 0;
    switch(CVar1) {
    case COMPAREMODE_LESS:
      if (fVar5 < fVar7) goto switchD_00a377a1_caseD_7;
      break;
    case COMPAREMODE_LESS_OR_EQUAL:
      if (fVar5 <= fVar7) goto switchD_00a377a1_caseD_7;
      break;
    case COMPAREMODE_GREATER:
      if (fVar7 < fVar5) goto switchD_00a377a1_caseD_7;
      break;
    case COMPAREMODE_GREATER_OR_EQUAL:
      if (fVar7 <= fVar5) goto switchD_00a377a1_caseD_7;
      break;
    case COMPAREMODE_EQUAL:
      if ((fVar5 == fVar7) && (!NAN(fVar5) && !NAN(fVar7))) goto switchD_00a377a1_caseD_7;
      break;
    case COMPAREMODE_NOT_EQUAL:
      if ((fVar5 != fVar7) || (NAN(fVar5) || NAN(fVar7))) goto switchD_00a377a1_caseD_7;
      break;
    case COMPAREMODE_ALWAYS:
switchD_00a377a1_caseD_7:
      uVar6 = 0x3f800000;
    }
    *(undefined4 *)(this + lVar3 * 4) = uVar6;
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      VVar8.m_data[3] = 0.0;
      VVar8.m_data[0] = 1.0;
      VVar8.m_data[1] = 0.0;
      VVar8.m_data[2] = 0.0;
      return (Vec4)VVar8.m_data;
    }
  } while( true );
}

Assistant:

Vec4 gatherArray2DOffsetsCompare (const ConstPixelBufferAccess& src, const Sampler& sampler, float ref, float s, float t, int depth, const IVec2 (&offsets)[4])
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);
	DE_ASSERT(src.getFormat().order == TextureFormat::D || src.getFormat().order == TextureFormat::DS);
	DE_ASSERT(sampler.compareChannel == 0);

	const bool	isFixedPoint	= isFixedPointDepthTextureFormat(src.getFormat());
	const Vec4	gathered		= fetchGatherArray2DOffsets(src, sampler, s, t, depth, 0 /* component 0: depth */, offsets);
	Vec4		result;

	for (int i = 0; i < 4; i++)
		result[i] = execCompare(gathered, sampler.compare, i, ref, isFixedPoint);

	return result;
}